

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer ppcVar1;
  cmGeneratorTarget *this_01;
  TargetType TVar2;
  pointer ppcVar3;
  ostream *poVar4;
  pointer ppcVar5;
  cmGeneratorTarget *gt;
  string tname;
  string local_60;
  pointer local_40;
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)cmakefileStream,"# Dependency information for all targets:\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n",0x1c);
  ppcVar3 = (lGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = (lGenerators->
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar3 != local_40) {
    do {
      this_00 = (cmLocalUnixMakefileGenerator3 *)*ppcVar3;
      ppcVar1 = (this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_38 = ppcVar3;
      for (ppcVar5 = (this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets
                     .super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1;
          ppcVar5 = ppcVar5 + 1) {
        this_01 = *ppcVar5;
        TVar2 = cmGeneratorTarget::GetType(this_01);
        if (TVar2 == EXECUTABLE) {
LAB_003304d8:
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    (&local_60,this_00,this_01);
          std::__cxx11::string::append((char *)&local_60);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)cmakefileStream,"  \"",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)cmakefileStream,local_60._M_dataplus._M_p,
                              local_60._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          TVar2 = cmGeneratorTarget::GetType(this_01);
          if (TVar2 == STATIC_LIBRARY) goto LAB_003304d8;
          TVar2 = cmGeneratorTarget::GetType(this_01);
          if (TVar2 == SHARED_LIBRARY) goto LAB_003304d8;
          TVar2 = cmGeneratorTarget::GetType(this_01);
          if (TVar2 == MODULE_LIBRARY) goto LAB_003304d8;
          TVar2 = cmGeneratorTarget::GetType(this_01);
          if (TVar2 == OBJECT_LIBRARY) goto LAB_003304d8;
          TVar2 = cmGeneratorTarget::GetType(this_01);
          if (TVar2 == UTILITY) goto LAB_003304d8;
        }
      }
      ppcVar3 = local_38 + 1;
    } while (ppcVar3 != local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)cmakefileStream,"  )\n",4);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules(
  cmGeneratedFileStream& cmakefileStream,
  std::vector<cmLocalGenerator*>& lGenerators)
{
  cmLocalUnixMakefileGenerator3* lg;

  // now list all the target info files
  cmakefileStream << "# Dependency information for all targets:\n";
  cmakefileStream << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (cmLocalGenerator* lGenerator : lGenerators) {
    lg = static_cast<cmLocalUnixMakefileGenerator3*>(lGenerator);
    // for all of out targets
    const std::vector<cmGeneratorTarget*>& tgts = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* tgt : tgts) {
      if ((tgt->GetType() == cmStateEnums::EXECUTABLE) ||
          (tgt->GetType() == cmStateEnums::STATIC_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::SHARED_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::MODULE_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::UTILITY)) {
        cmGeneratorTarget* gt = tgt;
        std::string tname = lg->GetRelativeTargetDirectory(gt);
        tname += "/DependInfo.cmake";
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
      }
    }
  }
  cmakefileStream << "  )\n";
}